

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O3

void gravity_hash_free(gravity_hash_t *hashtable)

{
  gravity_hash_iterate_fn p_Var1;
  hash_node_s *phVar2;
  uint uVar3;
  ulong uVar4;
  hash_node_t *__ptr;
  
  if (hashtable != (gravity_hash_t *)0x0) {
    uVar3 = hashtable->size;
    if (uVar3 != 0) {
      p_Var1 = hashtable->free_fn;
      uVar4 = 0;
      do {
        __ptr = hashtable->nodes[uVar4];
        hashtable->nodes[uVar4] = (hash_node_t *)0x0;
        if (__ptr != (hash_node_t *)0x0) {
          do {
            if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
              (*p_Var1)(hashtable,__ptr->key,__ptr->value,hashtable->data);
            }
            phVar2 = __ptr->next;
            free(__ptr);
            __ptr = phVar2;
          } while (phVar2 != (hash_node_s *)0x0);
          uVar3 = hashtable->size;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar3);
    }
    free(hashtable->nodes);
    free(hashtable);
    return;
  }
  return;
}

Assistant:

void gravity_hash_free (gravity_hash_t *hashtable) {
    if (!hashtable) return;
    gravity_hash_iterate_fn free_fn = hashtable->free_fn;

    for (uint32_t n = 0; n < hashtable->size; ++n) {
        hash_node_t *node = hashtable->nodes[n];
        hashtable->nodes[n] = NULL;
        while (node) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            hash_node_t *old_node = node;
            node = node->next;
            mem_free(old_node);
        }
    }
    mem_free(hashtable->nodes);
    mem_free(hashtable);
    hashtable = NULL;
}